

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O1

void duckdb::TemplatedRadixScatter<signed_char>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  idx_t iVar4;
  undefined7 in_register_00000089;
  idx_t iVar5;
  ulong uVar6;
  
  pdVar1 = vdata->data;
  if ((int)CONCAT71(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      iVar4 = 0;
      do {
        iVar5 = iVar4;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)sel->sel_vector[iVar4];
        }
        psVar2 = vdata->sel->sel_vector;
        if (psVar2 != (sel_t *)0x0) {
          iVar5 = (idx_t)psVar2[iVar5];
        }
        *key_locations[iVar4] = pdVar1[iVar5 + offset] + 0x80;
        if (desc) {
          *key_locations[iVar4] = ~*key_locations[iVar4];
        }
        key_locations[iVar4] = key_locations[iVar4] + 1;
        iVar4 = iVar4 + 1;
      } while (add_count != iVar4);
    }
  }
  else if (add_count != 0) {
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)sel->sel_vector[iVar4];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar5 = (idx_t)psVar2[iVar5];
      }
      uVar6 = iVar5 + offset;
      puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
        *key_locations[iVar4] = nulls_first;
        key_locations[iVar4][1] = pdVar1[uVar6] + 0x80;
        if (desc) {
          key_locations[iVar4][1] = ~key_locations[iVar4][1];
        }
      }
      else {
        *key_locations[iVar4] = !nulls_first;
        key_locations[iVar4][1] = '\0';
      }
      key_locations[iVar4] = key_locations[iVar4] + 2;
      iVar4 = iVar4 + 1;
    } while (add_count != iVar4);
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}